

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O1

void __thiscall cmFindPackageCommand::StoreVersionFound(cmFindPackageCommand *this)

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string ver;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  char *local_28;
  undefined8 local_20;
  
  local_48._8_8_ = (this->Name)._M_dataplus._M_p;
  local_48._M_unused._0_8_ = (undefined8)(this->Name)._M_string_length;
  local_38 = (code *)0x0;
  pcStack_30 = (code *)0x8;
  local_28 = "_VERSION";
  local_20 = 0;
  views._M_len = 2;
  views._M_array = (iterator)&local_48;
  cmCatViews(&ver,views);
  local_48._8_8_ = 0;
  pcStack_30 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmFindPackageCommand.cxx:2590:24)>
               ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmFindPackageCommand.cxx:2590:24)>
             ::_M_manager;
  local_48._M_unused._M_object = this;
  SetVersionVariables((cmFindPackageCommand *)(ulong)this->VersionFoundPatch,
                      (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
                       *)&local_48,&ver,&this->VersionFound,this->VersionFoundCount,
                      this->VersionFoundMajor,this->VersionFoundMinor,this->VersionFoundPatch,
                      this->VersionFoundTweak);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,3);
  }
  if ((this->VersionFound)._M_string_length == 0) {
    cmMakefile::RemoveDefinition((this->super_cmFindCommon).Makefile,&ver);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ver._M_dataplus._M_p != &ver.field_2) {
    operator_delete(ver._M_dataplus._M_p,ver.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmFindPackageCommand::StoreVersionFound()
{
  // Store the whole version string.
  std::string const ver = cmStrCat(this->Name, "_VERSION");
  auto addDefinition = [this](const std::string& variable,
                              cm::string_view value) {
    this->Makefile->AddDefinition(variable, value);
  };

  this->SetVersionVariables(addDefinition, ver, this->VersionFound,
                            this->VersionFoundCount, this->VersionFoundMajor,
                            this->VersionFoundMinor, this->VersionFoundPatch,
                            this->VersionFoundTweak);

  if (this->VersionFound.empty()) {
    this->Makefile->RemoveDefinition(ver);
  }
}